

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_int_&> __thiscall
kj::Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>>::
find<0ul,unsigned_int>
          (Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>> *this,
          StringPtr *params)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  uint *in_RDX;
  char *pcVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pcVar2 = (params->content).ptr;
  sVar3 = params[3].content.size_;
  if (sVar3 == 0) {
    bVar4 = false;
  }
  else {
    uVar1 = *in_RDX;
    uVar7 = uVar1 * 0x8000 + ~uVar1;
    uVar7 = (uVar7 >> 0xc ^ uVar7) * 5;
    uVar7 = (uVar7 >> 4 ^ uVar7) * 0x809;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    uVar8 = (ulong)((int)sVar3 - 1U & uVar7);
    pcVar5 = params[3].content.ptr;
    params = (StringPtr *)(ulong)*(uint *)(pcVar5 + uVar8 * 8 + 4);
    if (*(uint *)(pcVar5 + uVar8 * 8 + 4) != 0) {
      puVar6 = (uint *)(pcVar5 + uVar8 * 8);
      do {
        if ((((int)params != 1) && (*puVar6 == uVar7)) &&
           (params = (StringPtr *)(ulong)((int)params - 2),
           *(uint *)(pcVar2 + (long)params * 4) == uVar1)) {
          bVar4 = true;
          goto LAB_001630bc;
        }
        uVar9 = uVar8 + 1;
        uVar8 = 0;
        if (uVar9 != sVar3) {
          uVar8 = uVar9 & 0xffffffff;
        }
        puVar6 = (uint *)(pcVar5 + uVar8 * 8);
        params = (StringPtr *)(ulong)puVar6[1];
      } while (puVar6[1] != 0);
    }
    bVar4 = false;
  }
LAB_001630bc:
  pcVar5 = (char *)0x0;
  if (bVar4) {
    pcVar5 = pcVar2 + (long)params * 4;
  }
  *(char **)this = pcVar5;
  return (Maybe<unsigned_int_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}